

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstatemanager_args.cpp
# Opt level: O2

Result<void> * __thiscall
node::ApplyArgsManOptions
          (Result<void> *__return_storage_ptr__,node *this,ArgsManager *args,Options *opts)

{
  long lVar1;
  _Rb_tree_color _Var2;
  string original;
  string original_00;
  optional<bool> oVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int64_t iVar7;
  _Storage<long,_true> _Var8;
  uint uVar9;
  string *this_00;
  uint *in_R8;
  long in_FS_OFFSET;
  optional<long> oVar10;
  string_view input;
  string_view input_00;
  string_view source_file;
  string_view logging_function;
  undefined4 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7c [28];
  bilingual_str local_160;
  string local_120 [32];
  bilingual_str local_100;
  bilingual_str local_c0;
  optional<uint256> min_work;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"-checkblockindex",(allocator<char> *)&value);
  oVar10 = ArgsManager::GetIntArg((ArgsManager *)this,&local_100.original);
  std::__cxx11::string::~string((string *)&local_100);
  if (((undefined1  [16])
       oVar10.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"-checkblockindex",(allocator<char> *)&min_work);
    ArgsManager::GetArg((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_100,(ArgsManager *)this,(string *)&value);
    if ((args->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 ==
        '\0') {
      (args->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 = 1;
    }
    _Var2 = oVar10.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload._0_4_;
    if (local_100.original._M_string_length == 0) {
      _Var2 = _S_black;
    }
    (args->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var2
    ;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_100);
    std::__cxx11::string::~string((string *)&value);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"-checkpoints",(allocator<char> *)&value);
  oVar3 = ArgsManager::GetBoolArg((ArgsManager *)this,&local_100.original);
  std::__cxx11::string::~string((string *)&local_100);
  if (((ushort)oVar3.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    ((_Storage<bool,_true> *)
    &(args->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
    _M_value = oVar3.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool>._M_payload;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"-minimumchainwork",(allocator<char> *)&min_work);
  ArgsManager::GetArg(&value,(ArgsManager *)this,&local_100.original);
  std::__cxx11::string::~string((string *)&local_100);
  if (value.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    input._M_str = (char *)opts;
    input._M_len = (size_t)value.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_dataplus._M_p;
    detail::FromUserHex<uint256>
              (&min_work,
               (detail *)
               value.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length,input);
    if (min_work.super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged == true) {
      UintToArith256((arith_uint256 *)&local_100,(uint256 *)&min_work);
      std::optional<arith_uint256>::operator=
                ((optional<arith_uint256> *)
                 ((long)&(args->m_settings).forced_settings._M_t._M_impl.super__Rb_tree_header.
                         _M_header._M_parent + 4),(arith_uint256 *)&local_100);
      goto LAB_0076e30e;
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_120,"Invalid minimum work specified (%s), must be up to %d hex digits",
               (allocator<char> *)&stack0xfffffffffffffe7f);
    original._4_28_ = in_stack_fffffffffffffe7c;
    original._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe78;
    Untranslated(&local_100,original);
    tinyformat::format<std::__cxx11::string,unsigned_int>
              (&local_c0,(tinyformat *)&local_100,(bilingual_str *)&value,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffe78,in_R8);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_c0);
    bilingual_str::~bilingual_str(&local_c0);
    bilingual_str::~bilingual_str(&local_100);
    this_00 = local_120;
LAB_0076e644:
    std::__cxx11::string::~string(this_00);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&value);
  }
  else {
LAB_0076e30e:
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"-assumevalid",(allocator<char> *)&min_work);
    ArgsManager::GetArg(&value,(ArgsManager *)this,&local_100.original);
    std::__cxx11::string::~string((string *)&local_100);
    if (value.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      input_00._M_str = (char *)opts;
      input_00._M_len =
           (size_t)value.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p;
      detail::FromUserHex<uint256>
                (&min_work,
                 (detail *)
                 value.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_string_length,input_00);
      if (min_work.super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_engaged != true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&stack0xfffffffffffffe80,
                   "Invalid assumevalid block hash specified (%s), must be up to %d hex digits (or 0 to disable)"
                   ,(allocator<char> *)&stack0xfffffffffffffe7f);
        original_00._4_28_ = in_stack_fffffffffffffe7c;
        original_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe78;
        Untranslated(&local_100,original_00);
        tinyformat::format<std::__cxx11::string,unsigned_int>
                  (&local_160,(tinyformat *)&local_100,(bilingual_str *)&value,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe78,in_R8);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   &local_160);
        bilingual_str::~bilingual_str(&local_160);
        bilingual_str::~bilingual_str(&local_100);
        this_00 = (string *)&stack0xfffffffffffffe80;
        goto LAB_0076e644;
      }
      *(undefined8 *)
       &(args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header =
           min_work.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._0_8_;
      (args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
           = (_Base_ptr)
             min_work.super__Optional_base<uint256,_true,_true>._M_payload.
             super__Optional_payload_base<uint256>._M_payload._8_8_;
      (args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           min_work.super__Optional_base<uint256,_true,_true>._M_payload.
           super__Optional_payload_base<uint256>._M_payload._16_8_;
      (args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_header._M_right
           = (_Base_ptr)
             min_work.super__Optional_base<uint256,_true,_true>._M_payload.
             super__Optional_payload_base<uint256>._M_payload._24_8_;
      if ((char)(args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header.
                _M_node_count == '\0') {
        *(undefined1 *)
         &(args->m_settings).command_line_options._M_t._M_impl.super__Rb_tree_header._M_node_count =
             1;
      }
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"-maxtipage",(allocator<char> *)&value);
    oVar10 = ArgsManager::GetIntArg((ArgsManager *)this,&local_100.original);
    std::__cxx11::string::~string((string *)&local_100);
    if (((undefined1  [16])
         oVar10.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(long *)&(args->m_settings).rw_settings._M_t._M_impl =
           oVar10.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    ReadDatabaseArgs((ArgsManager *)this,
                     (DBOptions *)&(args->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header
                    );
    ReadDatabaseArgs((ArgsManager *)this,
                     (DBOptions *)
                     ((long)&(args->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_color + 1));
    ReadCoinsViewArgs((ArgsManager *)this,
                      (CoinsViewOptions *)
                      &(args->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"-par",(allocator<char> *)&value);
    iVar7 = ArgsManager::GetIntArg((ArgsManager *)this,&local_100.original,0);
    std::__cxx11::string::~string((string *)&local_100);
    iVar5 = (int)iVar7;
    if (iVar5 < 1) {
      iVar4 = GetNumCores();
      iVar5 = iVar4 + iVar5;
    }
    uVar9 = 0xf;
    if (iVar5 - 1U < 0xf) {
      uVar9 = iVar5 - 1U;
    }
    uVar6 = 0;
    if (0 < iVar5) {
      uVar6 = uVar9;
    }
    *(uint *)&(args->m_settings).ro_config._M_t._M_impl = uVar6;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstatemanager_args.cpp"
    ;
    source_file._M_len = 0x6f;
    logging_function._M_str = "ApplyArgsManOptions";
    logging_function._M_len = 0x13;
    LogPrintFormatInternal<int>
              (logging_function,source_file,0x40,ALL,Info,(ConstevalFormatString<1U>)0xc9f08c,
               (int *)&(args->m_settings).ro_config);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"-maxsigcachesize",(allocator<char> *)&value);
    oVar10 = ArgsManager::GetIntArg((ArgsManager *)this,&local_100.original);
    std::__cxx11::string::~string((string *)&local_100);
    if (((undefined1  [16])
         oVar10.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      _Var8._M_value = 0;
      if (0 < oVar10.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload) {
        _Var8._M_value =
             oVar10.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
      }
      *(_Base_ptr *)&(args->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_header =
           (_Base_ptr)(_Var8._M_value << 0x13);
      (args->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)(_Var8._M_value << 0x13);
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> ApplyArgsManOptions(const ArgsManager& args, ChainstateManager::Options& opts)
{
    if (auto value{args.GetIntArg("-checkblockindex")}) {
        // Interpret bare -checkblockindex argument as 1 instead of 0.
        opts.check_block_index = args.GetArg("-checkblockindex")->empty() ? 1 : *value;
    }

    if (auto value{args.GetBoolArg("-checkpoints")}) opts.checkpoints_enabled = *value;

    if (auto value{args.GetArg("-minimumchainwork")}) {
        if (auto min_work{uint256::FromUserHex(*value)}) {
            opts.minimum_chain_work = UintToArith256(*min_work);
        } else {
            return util::Error{strprintf(Untranslated("Invalid minimum work specified (%s), must be up to %d hex digits"), *value, uint256::size() * 2)};
        }
    }

    if (auto value{args.GetArg("-assumevalid")}) {
        if (auto block_hash{uint256::FromUserHex(*value)}) {
            opts.assumed_valid_block = *block_hash;
        } else {
            return util::Error{strprintf(Untranslated("Invalid assumevalid block hash specified (%s), must be up to %d hex digits (or 0 to disable)"), *value, uint256::size() * 2)};
        }
    }

    if (auto value{args.GetIntArg("-maxtipage")}) opts.max_tip_age = std::chrono::seconds{*value};

    ReadDatabaseArgs(args, opts.block_tree_db);
    ReadDatabaseArgs(args, opts.coins_db);
    ReadCoinsViewArgs(args, opts.coins_view);

    int script_threads = args.GetIntArg("-par", DEFAULT_SCRIPTCHECK_THREADS);
    if (script_threads <= 0) {
        // -par=0 means autodetect (number of cores - 1 script threads)
        // -par=-n means "leave n cores free" (number of cores - n - 1 script threads)
        script_threads += GetNumCores();
    }
    // Subtract 1 because the main thread counts towards the par threads.
    opts.worker_threads_num = std::clamp(script_threads - 1, 0, MAX_SCRIPTCHECK_THREADS);
    LogPrintf("Script verification uses %d additional threads\n", opts.worker_threads_num);

    if (auto max_size = args.GetIntArg("-maxsigcachesize")) {
        // 1. When supplied with a max_size of 0, both the signature cache and
        //    script execution cache create the minimum possible cache (2
        //    elements). Therefore, we can use 0 as a floor here.
        // 2. Multiply first, divide after to avoid integer truncation.
        size_t clamped_size_each = std::max<int64_t>(*max_size, 0) * (1 << 20) / 2;
        opts.script_execution_cache_bytes = clamped_size_each;
        opts.signature_cache_bytes = clamped_size_each;
    }

    return {};
}